

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int c1fgkb_(int *ido,int *ip,int *l1,int *lid,int *na,double *cc,double *cc1,int *in1,double *ch,
           double *ch1,int *in2,double *wa)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  ulong uVar20;
  double *pdVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  double *pdVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  double *pdVar34;
  int iVar35;
  long lVar36;
  double *pdVar37;
  long lVar38;
  double *local_120;
  double *local_108;
  double *local_e8;
  ulong local_a8;
  double *local_a0;
  
  iVar10 = *ido;
  lVar28 = (long)iVar10;
  iVar4 = *ip;
  lVar36 = (long)iVar4;
  uVar9 = ~(iVar4 * iVar10);
  iVar5 = *in1;
  lVar33 = (long)iVar5;
  iVar6 = *lid;
  lVar31 = (long)iVar6;
  uVar22 = iVar6 + 1;
  iVar7 = *in2;
  lVar13 = (long)iVar7;
  uVar20 = (ulong)uVar22;
  iVar8 = *l1;
  lVar16 = (long)iVar8;
  uVar14 = iVar4 + 1;
  lVar17 = (long)(int)~(uVar22 * iVar5);
  lVar38 = (long)(int)~(iVar7 * uVar22);
  if (0 < lVar31) {
    pdVar12 = ch1 + (lVar31 + 1) * lVar13 + lVar38 + 2;
    pdVar25 = cc1 + (lVar31 + 1) * lVar33 + lVar17 + 2;
    lVar32 = uVar20 - 1;
    do {
      pdVar12[-1] = pdVar25[-1];
      *pdVar12 = *pdVar25;
      pdVar12 = pdVar12 + lVar13;
      pdVar25 = pdVar25 + lVar33;
      lVar32 = lVar32 + -1;
    } while (lVar32 != 0);
  }
  uVar22 = iVar4 + 2;
  iVar35 = (iVar4 - ((int)uVar14 >> 0x1f)) + 1 >> 1;
  if (2 < iVar4) {
    iVar23 = 2;
    if (2 < iVar35) {
      iVar23 = iVar35;
    }
    lVar32 = ((ulong)uVar22 - 2) * lVar31 + 1;
    pdVar25 = ch1 + lVar32 * lVar13 + 2;
    pdVar34 = cc1 + lVar32 * lVar33 + lVar17;
    lVar32 = lVar31 * 2 + 1;
    pdVar21 = ch1 + lVar32 * lVar13 + 2;
    pdVar12 = cc1 + lVar32 * lVar33 + lVar17;
    uVar11 = 2;
    do {
      if (0 < iVar6) {
        lVar24 = 0x10;
        pdVar19 = pdVar25;
        lVar32 = uVar20 - 1;
        pdVar37 = pdVar21;
        do {
          pdVar37[lVar38 + -1] =
               *(double *)((long)pdVar12 + lVar24 + -8) + *(double *)((long)pdVar34 + lVar24 + -8);
          pdVar19[lVar38 + -1] =
               *(double *)((long)pdVar12 + lVar24 + -8) - *(double *)((long)pdVar34 + lVar24 + -8);
          pdVar37[lVar38] =
               *(double *)((long)pdVar12 + lVar24) + *(double *)((long)pdVar34 + lVar24);
          pdVar19[lVar38] =
               *(double *)((long)pdVar12 + lVar24) - *(double *)((long)pdVar34 + lVar24);
          pdVar19 = pdVar19 + lVar13;
          lVar24 = lVar24 + lVar33 * 8;
          pdVar37 = pdVar37 + lVar13;
          lVar32 = lVar32 + -1;
        } while (lVar32 != 0);
      }
      uVar11 = uVar11 + 1;
      pdVar25 = pdVar25 + -(lVar31 * lVar13);
      pdVar34 = pdVar34 + -(lVar31 * lVar33);
      pdVar21 = pdVar21 + lVar31 * lVar13;
      pdVar12 = pdVar12 + lVar31 * lVar33;
    } while (uVar11 != iVar23 + 1);
  }
  if (2 < iVar4) {
    iVar23 = 2;
    if (2 < iVar35) {
      iVar23 = iVar35;
    }
    pdVar12 = ch1 + (lVar31 * 2 + 1) * lVar13 + lVar38 + 2;
    uVar11 = 2;
    do {
      lVar32 = uVar20 - 1;
      pdVar25 = pdVar12;
      pdVar21 = cc1 + (lVar31 + 1) * lVar33 + lVar17 + 2;
      if (0 < iVar6) {
        do {
          pdVar21[-1] = pdVar25[-1] + pdVar21[-1];
          *pdVar21 = *pdVar25 + *pdVar21;
          pdVar21 = pdVar21 + lVar33;
          pdVar25 = pdVar25 + lVar13;
          lVar32 = lVar32 + -1;
        } while (lVar32 != 0);
      }
      uVar11 = uVar11 + 1;
      pdVar12 = pdVar12 + lVar31 * lVar13;
    } while (uVar11 != iVar23 + 1);
  }
  iVar23 = (int)(lVar36 + -1);
  if (2 < iVar4) {
    iVar26 = 3;
    if (3 < iVar35) {
      iVar26 = iVar35;
    }
    iVar27 = 2;
    if (2 < iVar35) {
      iVar27 = iVar35;
    }
    lVar24 = (((ulong)uVar22 - 2) * lVar31 + 1) * lVar33;
    pdVar12 = cc1 + lVar24 + lVar17;
    lVar29 = lVar31 * lVar33;
    lVar32 = (lVar31 * 2 + 1) * lVar33;
    pdVar25 = cc1 + lVar32 + lVar17;
    local_108 = cc1 + lVar24 + 2;
    local_a0 = cc1 + lVar32 + 2;
    local_a8 = 2;
    do {
      if (0 < iVar6) {
        lVar24 = (lVar36 + -1 + local_a8 + -1) * lVar28;
        lVar18 = ((long)(iVar23 * 2) + local_a8 + -1) * lVar28;
        lVar30 = 0x10;
        lVar32 = uVar20 - 1;
        pdVar21 = ch1 + ((long)(iVar6 * iVar4) + 1) * lVar13 + 2;
        pdVar34 = ch1 + (lVar31 + 1) * lVar13 + 2;
        pdVar19 = ch1 + ((long)(iVar6 * 2) + 1) * lVar13 + 2;
        do {
          *(double *)((long)pdVar25 + lVar30 + -8) =
               wa[(long)(int)uVar9 + lVar24 + 1] * pdVar19[lVar38 + -1] + pdVar34[lVar38 + -1];
          *(double *)((long)pdVar12 + lVar30 + -8) =
               wa[(long)(int)uVar9 + lVar18 + 1] * pdVar21[lVar38 + -1];
          *(double *)((long)pdVar25 + lVar30) =
               wa[(long)(int)uVar9 + lVar24 + 1] * pdVar19[lVar38] + pdVar34[lVar38];
          *(double *)((long)pdVar12 + lVar30) = wa[(long)(int)uVar9 + lVar18 + 1] * pdVar21[lVar38];
          lVar30 = lVar30 + lVar33 * 8;
          pdVar21 = pdVar21 + lVar13;
          pdVar19 = pdVar19 + lVar13;
          pdVar34 = pdVar34 + lVar13;
          lVar32 = lVar32 + -1;
        } while (lVar32 != 0);
      }
      if (4 < iVar4) {
        uVar11 = 3;
        pdVar21 = ch1 + (((ulong)uVar22 - 3) * lVar31 + 1) * lVar13 + lVar38;
        pdVar34 = ch1 + (lVar31 * 3 + 1) * lVar13 + lVar38;
        do {
          iVar15 = (((int)uVar11 + -1) * ((int)local_a8 + -1)) % iVar4;
          if (0 < iVar6) {
            dVar1 = wa[(long)(int)uVar9 + (long)((iVar23 + iVar15) * iVar10) + 1];
            dVar2 = wa[(long)(int)uVar9 + (long)((iVar15 + iVar23 * 2) * iVar10) + 1];
            lVar24 = 0x10;
            lVar32 = uVar20 - 1;
            pdVar19 = local_108;
            pdVar37 = local_a0;
            do {
              pdVar37[lVar17 + -1] =
                   *(double *)((long)pdVar34 + lVar24 + -8) * dVar1 + pdVar37[lVar17 + -1];
              pdVar19[lVar17 + -1] =
                   *(double *)((long)pdVar21 + lVar24 + -8) * dVar2 + pdVar19[lVar17 + -1];
              pdVar37[lVar17] = *(double *)((long)pdVar34 + lVar24) * dVar1 + pdVar37[lVar17];
              pdVar19[lVar17] = *(double *)((long)pdVar21 + lVar24) * dVar2 + pdVar19[lVar17];
              pdVar19 = pdVar19 + lVar33;
              lVar24 = lVar24 + lVar13 * 8;
              pdVar37 = pdVar37 + lVar33;
              lVar32 = lVar32 + -1;
            } while (lVar32 != 0);
          }
          uVar11 = uVar11 + 1;
          pdVar21 = pdVar21 + -(lVar31 * lVar13);
          pdVar34 = pdVar34 + lVar31 * lVar13;
        } while (uVar11 != iVar26 + 1);
      }
      local_a8 = local_a8 + 1;
      pdVar12 = pdVar12 + -lVar29;
      pdVar25 = pdVar25 + lVar29;
      local_108 = local_108 + -lVar29;
      local_a0 = local_a0 + lVar29;
    } while (local_a8 != iVar27 + 1);
  }
  if ((iVar10 < 2) && (*na != 1)) {
    if (2 < iVar4) {
      iVar10 = 2;
      if (2 < iVar35) {
        iVar10 = iVar35;
      }
      pdVar12 = cc1 + (((ulong)uVar22 - 2) * lVar31 + 1) * lVar33 + lVar17 + 2;
      pdVar25 = cc1 + (lVar31 * 2 + 1) * lVar33 + lVar17 + 2;
      uVar11 = 2;
      do {
        if (0 < iVar6) {
          lVar16 = 0;
          lVar13 = uVar20 - 1;
          do {
            dVar1 = *(double *)((long)pdVar12 + lVar16);
            dVar2 = *(double *)((long)pdVar25 + lVar16 + -8);
            *(double *)((long)pdVar25 + lVar16 + -8) = dVar2 - dVar1;
            dVar3 = *(double *)((long)pdVar12 + lVar16 + -8);
            *(double *)((long)pdVar12 + lVar16) = *(double *)((long)pdVar25 + lVar16) - dVar3;
            *(double *)((long)pdVar25 + lVar16) = dVar3 + *(double *)((long)pdVar25 + lVar16);
            *(double *)((long)pdVar12 + lVar16 + -8) = dVar2 + dVar1;
            lVar16 = lVar16 + lVar33 * 8;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
        uVar11 = uVar11 + 1;
        pdVar12 = pdVar12 + -(lVar31 * lVar33);
        pdVar25 = pdVar25 + lVar31 * lVar33;
      } while (uVar11 != iVar10 + 1);
    }
  }
  else {
    if (0 < iVar6) {
      pdVar12 = ch1 + (lVar31 + 1) * lVar13 + lVar38 + 2;
      pdVar25 = cc1 + (lVar31 + 1) * lVar33 + lVar17 + 2;
      lVar32 = uVar20 - 1;
      do {
        pdVar12[-1] = pdVar25[-1];
        *pdVar12 = *pdVar25;
        pdVar12 = pdVar12 + lVar13;
        pdVar25 = pdVar25 + lVar33;
        lVar32 = lVar32 + -1;
      } while (lVar32 != 0);
    }
    if (2 < iVar4) {
      iVar26 = 2;
      if (2 < iVar35) {
        iVar26 = iVar35;
      }
      lVar32 = ((ulong)uVar22 - 2) * lVar31 + 1;
      pdVar12 = ch1 + lVar32 * lVar13 + 2;
      pdVar21 = cc1 + lVar32 * lVar33 + lVar17;
      lVar32 = lVar31 * 2 + 1;
      pdVar25 = ch1 + lVar32 * lVar13 + 2;
      pdVar34 = cc1 + lVar32 * lVar33 + lVar17;
      uVar11 = 2;
      do {
        if (0 < iVar6) {
          lVar32 = 0x10;
          pdVar19 = pdVar12;
          lVar17 = uVar20 - 1;
          pdVar37 = pdVar25;
          do {
            pdVar37[lVar38 + -1] =
                 *(double *)((long)pdVar34 + lVar32 + -8) - *(double *)((long)pdVar21 + lVar32);
            pdVar19[lVar38 + -1] =
                 *(double *)((long)pdVar34 + lVar32 + -8) + *(double *)((long)pdVar21 + lVar32);
            pdVar19[lVar38] =
                 *(double *)((long)pdVar34 + lVar32) - *(double *)((long)pdVar21 + lVar32 + -8);
            pdVar37[lVar38] =
                 *(double *)((long)pdVar34 + lVar32) + *(double *)((long)pdVar21 + lVar32 + -8);
            pdVar19 = pdVar19 + lVar13;
            lVar32 = lVar32 + lVar33 * 8;
            pdVar37 = pdVar37 + lVar13;
            lVar17 = lVar17 + -1;
          } while (lVar17 != 0);
        }
        uVar11 = uVar11 + 1;
        pdVar12 = pdVar12 + -(lVar31 * lVar13);
        pdVar21 = pdVar21 + -(lVar31 * lVar33);
        pdVar25 = pdVar25 + lVar31 * lVar13;
        pdVar34 = pdVar34 + lVar31 * lVar33;
      } while (uVar11 != iVar26 + 1);
    }
    if (iVar10 != 1) {
      uVar22 = iVar10 + 1;
      lVar31 = (long)(int)(~(iVar8 * uVar14) * iVar5 + -1);
      lVar17 = (long)(int)(~(iVar8 * uVar22) * iVar7 + -1);
      if (0 < iVar10) {
        pdVar12 = cc + ((lVar36 + 1) * lVar16 + 1) * lVar33 + lVar31 + 2;
        pdVar25 = ch + ((lVar28 + 1) * lVar16 + 1) * lVar13 + lVar17 + 2;
        uVar20 = 1;
        do {
          pdVar21 = pdVar12;
          lVar38 = (ulong)(iVar8 + 1) - 1;
          pdVar34 = pdVar25;
          if (0 < iVar8) {
            do {
              pdVar21[-1] = pdVar34[-1];
              *pdVar21 = *pdVar34;
              pdVar21 = pdVar21 + lVar33;
              pdVar34 = pdVar34 + lVar13;
              lVar38 = lVar38 + -1;
            } while (lVar38 != 0);
          }
          uVar20 = uVar20 + 1;
          pdVar12 = pdVar12 + lVar36 * lVar16 * lVar33;
          pdVar25 = pdVar25 + lVar16 * lVar13;
        } while (uVar20 != uVar22);
      }
      if (1 < iVar4) {
        pdVar12 = cc + ((lVar36 + 2) * lVar16 + 1) * lVar33 + lVar31 + 2;
        pdVar25 = ch + ((lVar28 * 2 + 1) * lVar16 + 1) * lVar13 + lVar17 + 2;
        uVar20 = 2;
        do {
          pdVar21 = pdVar12;
          lVar38 = (ulong)(iVar8 + 1) - 1;
          pdVar34 = pdVar25;
          if (0 < iVar8) {
            do {
              pdVar21[-1] = pdVar34[-1];
              *pdVar21 = *pdVar34;
              pdVar21 = pdVar21 + lVar33;
              pdVar34 = pdVar34 + lVar13;
              lVar38 = lVar38 + -1;
            } while (lVar38 != 0);
          }
          uVar20 = uVar20 + 1;
          pdVar12 = pdVar12 + lVar16 * lVar33;
          pdVar25 = pdVar25 + lVar28 * lVar16 * lVar13;
        } while (uVar20 != uVar14);
      }
      if (1 < iVar4) {
        local_e8 = cc + ((lVar36 * 2 + 2) * lVar16 + 1) * lVar33 + lVar31 + 2;
        local_120 = ch + ((lVar28 * 2 + 2) * lVar16 + 1) * lVar13 + lVar17 + 2;
        uVar20 = 2;
        do {
          if (1 < iVar10) {
            lVar17 = ((long)iVar23 + uVar20 + -1) * lVar28;
            lVar31 = ((long)(iVar23 * 2) + uVar20 + -1) * lVar28;
            uVar11 = 2;
            pdVar12 = local_120;
            pdVar25 = local_e8;
            do {
              lVar38 = (ulong)(iVar8 + 1) - 1;
              pdVar21 = pdVar25;
              pdVar34 = pdVar12;
              if (0 < iVar8) {
                do {
                  pdVar21[-1] = wa[(long)(int)uVar9 + lVar17 + uVar11] * pdVar34[-1] -
                                *pdVar34 * wa[(long)(int)uVar9 + lVar31 + uVar11];
                  *pdVar21 = wa[(long)(int)uVar9 + lVar17 + uVar11] * *pdVar34 +
                             wa[(long)(int)uVar9 + lVar31 + uVar11] * pdVar34[-1];
                  lVar38 = lVar38 + -1;
                  pdVar21 = pdVar21 + lVar33;
                  pdVar34 = pdVar34 + lVar13;
                } while (lVar38 != 0);
              }
              uVar11 = uVar11 + 1;
              pdVar25 = pdVar25 + lVar16 * lVar33 * lVar36;
              pdVar12 = pdVar12 + lVar16 * lVar13;
            } while (uVar11 != uVar22);
          }
          uVar20 = uVar20 + 1;
          local_e8 = local_e8 + lVar16 * lVar33;
          local_120 = local_120 + lVar16 * lVar13 * lVar28;
        } while (uVar20 != uVar14);
      }
    }
  }
  return 0;
}

Assistant:

int c1fgkb_(int *ido, int *ip, int *l1, int *
	lid, int *na, fft_real_t *cc, fft_real_t *cc1, int *in1, fft_real_t *ch, fft_real_t *
	ch1, int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int ch_dim1, ch_dim2, ch_dim3, ch_offset, cc_dim1, cc_dim2, cc_dim3,
	    cc_offset, cc1_dim1, cc1_dim2, cc1_offset, ch1_dim1, ch1_dim2,
	    ch1_offset, wa_dim1, wa_dim2, wa_offset, i__1, i__2, i__3;

    /* Local variables */
     int i__, j, k, l, jc, lc, ki;
     fft_real_t wai, war;
     int ipp2, idlj, ipph;
     fft_real_t chold1, chold2;


/* FFTPACK 5.1 auxiliary routine */

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_dim2 = *ip - 1;
    wa_offset = 1 + wa_dim1 * (1 + wa_dim2);
    wa -= wa_offset;
    cc1_dim1 = *in1;
    cc1_dim2 = *lid;
    cc1_offset = 1 + cc1_dim1 * (1 + cc1_dim2);
    cc1 -= cc1_offset;
    cc_dim1 = *in1;
    cc_dim2 = *l1;
    cc_dim3 = *ip;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch1_dim1 = *in2;
    ch1_dim2 = *lid;
    ch1_offset = 1 + ch1_dim1 * (1 + ch1_dim2);
    ch1 -= ch1_offset;
    ch_dim1 = *in2;
    ch_dim2 = *l1;
    ch_dim3 = *ido;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    ipp2 = *ip + 2;
    ipph = (*ip + 1) / 2;
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 2];
/* L110: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    2];
/* L112: */
	}
/* L111: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    cc1[(ki + cc1_dim2) * cc1_dim1 + 1] += ch1[(ki + j * ch1_dim2) *
		    ch1_dim1 + 1];
	    cc1[(ki + cc1_dim2) * cc1_dim1 + 2] += ch1[(ki + j * ch1_dim2) *
		    ch1_dim1 + 2];
/* L117: */
	}
/* L118: */
    }
    i__1 = ipph;
    for (l = 2; l <= i__1; ++l) {
	lc = ipp2 - l;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    cc1[(ki + l * cc1_dim2) * cc1_dim1 + 1] = ch1[(ki + ch1_dim2) *
		    ch1_dim1 + 1] + wa[(l - 1 + wa_dim2) * wa_dim1 + 1] * ch1[
		    (ki + (ch1_dim2 << 1)) * ch1_dim1 + 1];
	    cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 1] = wa[(l - 1 + (wa_dim2 <<
		     1)) * wa_dim1 + 1] * ch1[(ki + *ip * ch1_dim2) *
		    ch1_dim1 + 1];
	    cc1[(ki + l * cc1_dim2) * cc1_dim1 + 2] = ch1[(ki + ch1_dim2) *
		    ch1_dim1 + 2] + wa[(l - 1 + wa_dim2) * wa_dim1 + 1] * ch1[
		    (ki + (ch1_dim2 << 1)) * ch1_dim1 + 2];
	    cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 2] = wa[(l - 1 + (wa_dim2 <<
		     1)) * wa_dim1 + 1] * ch1[(ki + *ip * ch1_dim2) *
		    ch1_dim1 + 2];
/* L113: */
	}
	i__2 = ipph;
	for (j = 3; j <= i__2; ++j) {
	    jc = ipp2 - j;
	    idlj = (l - 1) * (j - 1) % *ip;
	    war = wa[(idlj + wa_dim2) * wa_dim1 + 1];
	    wai = wa[(idlj + (wa_dim2 << 1)) * wa_dim1 + 1];
	    i__3 = *lid;
	    for (ki = 1; ki <= i__3; ++ki) {
		cc1[(ki + l * cc1_dim2) * cc1_dim1 + 1] += war * ch1[(ki + j *
			 ch1_dim2) * ch1_dim1 + 1];
		cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 1] += wai * ch1[(ki +
			jc * ch1_dim2) * ch1_dim1 + 1];
		cc1[(ki + l * cc1_dim2) * cc1_dim1 + 2] += war * ch1[(ki + j *
			 ch1_dim2) * ch1_dim1 + 2];
		cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 2] += wai * ch1[(ki +
			jc * ch1_dim2) * ch1_dim1 + 2];
/* L114: */
	    }
/* L115: */
	}
/* L116: */
    }
    if (*ido > 1 || *na == 1) {
	goto L136;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    chold1 = cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] - cc1[(ki + jc *
		    cc1_dim2) * cc1_dim1 + 2];
	    chold2 = cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] + cc1[(ki + jc *
		    cc1_dim2) * cc1_dim1 + 2];
	    cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] = chold1;
	    cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
	    cc1[(ki + j * cc1_dim2) * cc1_dim1 + 2] += cc1[(ki + jc *
		    cc1_dim2) * cc1_dim1 + 1];
	    cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1] = chold2;
/* L119: */
	}
/* L120: */
    }
    return 0;
L136:
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 2];
/* L137: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    2];
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1]
		    ;
/* L134: */
	}
/* L135: */
    }
    if (*ido == 1) {
	return 0;
    }
    i__1 = *ido;
    for (i__ = 1; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(k + (i__ * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = ch[(k + (
		    i__ + ch_dim3) * ch_dim2) * ch_dim1 + 1];
	    cc[(k + (i__ * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] = ch[(k + (
		    i__ + ch_dim3) * ch_dim2) * ch_dim1 + 2];
/* L130: */
	}
/* L131: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(k + (j + cc_dim3) * cc_dim2) * cc_dim1 + 1] = ch[(k + (j *
		    ch_dim3 + 1) * ch_dim2) * ch_dim1 + 1];
	    cc[(k + (j + cc_dim3) * cc_dim2) * cc_dim1 + 2] = ch[(k + (j *
		    ch_dim3 + 1) * ch_dim2) * ch_dim1 + 2];
/* L122: */
	}
/* L123: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *ido;
	for (i__ = 2; i__ <= i__2; ++i__) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		cc[(k + (j + i__ * cc_dim3) * cc_dim2) * cc_dim1 + 1] = wa[
			i__ + (j - 1 + wa_dim2) * wa_dim1] * ch[(k + (i__ + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 1] - wa[i__ + (j -
			1 + (wa_dim2 << 1)) * wa_dim1] * ch[(k + (i__ + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 2];
		cc[(k + (j + i__ * cc_dim3) * cc_dim2) * cc_dim1 + 2] = wa[
			i__ + (j - 1 + wa_dim2) * wa_dim1] * ch[(k + (i__ + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 2] + wa[i__ + (j -
			1 + (wa_dim2 << 1)) * wa_dim1] * ch[(k + (i__ + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L124: */
	    }
/* L125: */
	}
/* L126: */
    }
    return 0;
}